

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::python::Generator::
ModuleLevelDescriptorName<google::protobuf::Descriptor>
          (string *__return_storage_ptr__,Generator *this,Descriptor *descriptor)

{
  FileDescriptor *pFVar1;
  string *filename;
  string local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  allocator local_49;
  string local_48;
  undefined1 local_21;
  Descriptor *local_20;
  Descriptor *descriptor_local;
  Generator *this_local;
  string *name;
  
  local_21 = 0;
  local_20 = descriptor;
  descriptor_local = (Descriptor *)this;
  this_local = (Generator *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_48,"_",&local_49);
  anon_unknown_0::NamePrefixedWithNestedTypes<google::protobuf::Descriptor>
            (__return_storage_ptr__,descriptor,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  ToUpper(__return_storage_ptr__);
  std::operator+(&local_80,"_",__return_storage_ptr__);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  pFVar1 = Descriptor::file(local_20);
  if (pFVar1 != this->file_) {
    pFVar1 = Descriptor::file(local_20);
    filename = FileDescriptor::name_abi_cxx11_(pFVar1);
    anon_unknown_0::ModuleAlias(&local_e0,filename);
    std::operator+(&local_c0,&local_e0,".");
    std::operator+(&local_a0,&local_c0,__return_storage_ptr__);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_e0);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Generator::ModuleLevelDescriptorName(
    const DescriptorT& descriptor) const {
  // FIXME(robinson):
  // We currently don't worry about collisions with underscores in the type
  // names, so these would collide in nasty ways if found in the same file:
  //   OuterProto.ProtoA.ProtoB
  //   OuterProto_ProtoA.ProtoB  # Underscore instead of period.
  // As would these:
  //   OuterProto.ProtoA_.ProtoB
  //   OuterProto.ProtoA._ProtoB  # Leading vs. trailing underscore.
  // (Contrived, but certainly possible).
  //
  // The C++ implementation doesn't guard against this either.  Leaving
  // it for now...
  std::string name = NamePrefixedWithNestedTypes(descriptor, "_");
  ToUpper(&name);
  // Module-private for now.  Easy to make public later; almost impossible
  // to make private later.
  name = "_" + name;
  // We now have the name relative to its own module.  Also qualify with
  // the module name iff this descriptor is from a different .proto file.
  if (descriptor.file() != file_) {
    name = ModuleAlias(descriptor.file()->name()) + "." + name;
  }
  return name;
}